

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O2

void __thiscall
DynamicGraph::bfs(DynamicGraph *this,Vertex *s,vector<bool,_std::allocator<bool>_> *visited,
                 unsigned_long startingLevel)

{
  _List_node_base *p_Var1;
  pointer psVar2;
  pointer psVar3;
  pointer puVar4;
  pointer psVar5;
  AdjList *g;
  reference rVar6;
  Vertex u;
  list<unsigned_long,_std::allocator<unsigned_long>_> queue;
  size_type local_50;
  _List_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48._M_impl._M_node._M_size = 0;
  (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[*s] = startingLevel;
  local_48._M_impl._M_node.super__List_node_base._M_prev =
       local_48._M_impl._M_node.super__List_node_base._M_next;
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](visited,*s);
  *rVar6._M_p = *rVar6._M_p | rVar6._M_mask;
  (this->components).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[*s] = this->nextComponent;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,s);
  while (local_48._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_48) {
    p_Var1 = local_48._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::pop_front
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48);
    psVar2 = (this->super_UndirectedGraph).super_type.m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = *(pointer *)
              ((long)&psVar2[(long)p_Var1].super_StoredVertex.m_out_edges.
                      super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
              + 8);
    for (psVar5 = *(pointer *)
                   &psVar2[(long)p_Var1].super_StoredVertex.m_out_edges.
                    super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
        ; psVar5 != psVar3; psVar5 = psVar5 + 1) {
      local_50 = (psVar5->super_stored_edge<unsigned_long>).m_target;
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](visited,local_50);
      if ((*rVar6._M_p & rVar6._M_mask) == 0) {
        puVar4 = (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar4[local_50] = puVar4[(long)p_Var1] + 1;
        (this->components).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start[local_50] = this->nextComponent;
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](visited,local_50);
        *rVar6._M_p = *rVar6._M_p | rVar6._M_mask;
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,&local_50);
      }
    }
  }
  std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear(&local_48);
  return;
}

Assistant:

void DynamicGraph::bfs(const Vertex &s, std::vector<bool> &visited, const unsigned long startingLevel)
{
    std::list<Vertex> queue;
    this->level[s] = startingLevel;
    visited[s]=true;
    this->components[s] = this->nextComponent;
    queue.push_back(s);

    // Basic BFS
    while(!queue.empty()) {
        Vertex v = queue.front();
        queue.pop_front();

        OutEdgeIterator ei, ei_end;
        for(boost::tie(ei, ei_end) = out_edges(v, *this); ei != ei_end; ++ei) {
            Vertex u = target(*ei, *this);
            if(!visited[u]){
                level[u] = this->level[v]+1;
                this->components[u] = this->nextComponent;
                visited[u]=true;
                queue.push_back(u);
            }
        }
    }
}